

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O1

bool BicTest3<Blob<128>,Blob<256>>(pfHash hash,int reps,bool verbose)

{
  long lVar1;
  ulong uVar2;
  int *piVar3;
  int b;
  uint32_t uVar4;
  uint32_t uVar5;
  void *__s;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int keybit;
  ulong uVar10;
  uint32_t bit;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined8 in_XMM7_Qb;
  Blob<128> key;
  Blob<256> h2;
  Blob<256> h1;
  Blob<256> d;
  uint local_104;
  uint local_f4;
  long local_e8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Rand local_a8;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  
  local_a8.x = 0x88e23b73;
  local_a8.y = 0x11310f6c;
  local_a8.z = 0x18847f4;
  local_a8.w = 0x1142a2ba;
  local_b8 = 0;
  uStack_b0 = 0;
  local_98 = ZEXT1632(ZEXT816(0));
  local_78 = local_98;
  __s = operator_new(0x8000000);
  lVar13 = 0;
  memset(__s,0,0x8000000);
  local_e8 = (long)__s + 0x10;
  do {
    bit = (uint32_t)lVar13;
    if ((bit * -0x55555555 >> 2 | bit * -0x40000000) < 0x15555556) {
      putchar(0x2e);
    }
    if (0 < reps) {
      local_f4 = 0;
      do {
        Rand::rand_p(&local_a8,&local_b8,0x10);
        (*hash)(&local_b8,0x10,0,local_78);
        flipbit(&local_b8,0x10,bit);
        (*hash)(&local_b8,0x10,0,local_98);
        local_58._0_8_ = local_98._0_8_ ^ local_78._0_8_;
        local_58._8_8_ = local_98._8_8_ ^ local_78._8_8_;
        local_58._16_8_ = local_98._16_8_ ^ local_78._16_8_;
        local_58._24_8_ = local_98._24_8_ ^ local_78._24_8_;
        lVar11 = -0xff;
        lVar8 = local_e8;
        lVar17 = 0;
        do {
          lVar1 = lVar17 + 1;
          lVar12 = lVar11;
          lVar16 = lVar8;
          do {
            uVar4 = getbit(local_58,0x20,(uint32_t)lVar17);
            uVar5 = getbit(local_58,0x20,(int)lVar12 + 0x100);
            piVar3 = (int *)(lVar16 + (ulong)(uVar5 * 2 | uVar4) * 4);
            *piVar3 = *piVar3 + 1;
            lVar16 = lVar16 + 0x10;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0);
          lVar8 = lVar8 + 0x1010;
          lVar11 = lVar11 + 1;
          lVar17 = lVar1;
        } while (lVar1 != 0xff);
        local_f4 = local_f4 + 1;
      } while (local_f4 != reps);
    }
    lVar13 = lVar13 + 1;
    local_e8 = local_e8 + 0x100000;
  } while (lVar13 != 0x80);
  putchar(10);
  lVar13 = (long)__s + 0x10;
  auVar18 = ZEXT864(0) << 0x40;
  uVar6 = 1;
  auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar14 = 0;
  local_104 = 0;
  local_f4 = 0;
  uVar7 = 0;
  do {
    uVar2 = uVar7 + 1;
    uVar15 = uVar6;
    lVar8 = lVar13;
    do {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar7 & 0xffffffff,uVar15 & 0xffffffff);
        auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar18 = ZEXT864(auVar18._0_8_);
      }
      uVar10 = 0;
      lVar17 = lVar8;
      do {
        auVar21 = ZEXT864(0) << 0x40;
        lVar11 = 0;
        do {
          auVar19._0_8_ = (double)*(int *)(lVar17 + lVar11 * 4) / (double)(reps / 2);
          auVar19._8_8_ = in_XMM7_Qb;
          auVar19 = vfmadd213sd_fma(auVar19,auVar22._0_16_,auVar23._0_16_);
          auVar19 = vandpd_avx(auVar19,auVar24._0_16_);
          auVar19 = vmaxsd_avx(auVar19,auVar21._0_16_);
          auVar21 = ZEXT1664(auVar19);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
        dVar20 = auVar19._0_8_;
        if (auVar18._0_8_ < dVar20) {
          uVar14 = uVar10 & 0xffffffff;
          auVar18 = ZEXT1664(auVar19);
          local_104 = (uint)uVar7;
          local_f4 = (uint)uVar15;
        }
        if (verbose) {
          iVar9 = 0x2e;
          if ((0.01 <= dVar20) && (iVar9 = 0x6f, 0.05 <= dVar20)) {
            iVar9 = (uint)(0.33 <= dVar20) * 9 + 0x4f;
          }
          putchar(iVar9);
          auVar18 = ZEXT864(auVar18._0_8_);
          auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        }
        uVar10 = uVar10 + 1;
        lVar17 = lVar17 + 0x100000;
      } while (uVar10 != 0x80);
      if (verbose) {
        putchar(10);
        auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar18 = ZEXT864(auVar18._0_8_);
      }
      uVar15 = uVar15 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar15 != 0x100);
    if (verbose) {
      iVar9 = 0x8c;
      do {
        putchar(0x2d);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      putchar(10);
      auVar18 = ZEXT864(auVar18._0_8_);
      auVar22 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar23 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar24 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    uVar6 = uVar6 + 1;
    lVar13 = lVar13 + 0x1010;
    uVar7 = uVar2;
  } while (uVar2 != 0xff);
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar14,(ulong)local_104,(ulong)local_f4);
  operator_delete(__s);
  return auVar18._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}